

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildUint16x8_2Int8
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot,RegSlot src4RegSlot,
          RegSlot src5RegSlot,RegSlot src6RegSlot,RegSlot src7RegSlot,RegSlot src8RegSlot,
          RegSlot src9RegSlot)

{
  code *pcVar1;
  bool bVar2;
  RegOpnd *this_00;
  RegOpnd *pRVar3;
  RegOpnd *src1;
  RegOpnd *src1_00;
  RegOpnd *src1_01;
  RegOpnd *src1_02;
  RegOpnd *src1_03;
  RegOpnd *src1_04;
  RegOpnd *src1_05;
  RegOpnd *src1_06;
  Instr *pIVar4;
  undefined4 *puVar5;
  undefined6 in_register_00000032;
  
  this_00 = BuildDstOpnd(this,dstRegSlot,TySimd128U8);
  pRVar3 = BuildSrcOpnd(this,src1RegSlot,TySimd128U8);
  src1 = BuildIntConstOpnd(this,src2RegSlot);
  src1_00 = BuildIntConstOpnd(this,src3RegSlot);
  src1_01 = BuildIntConstOpnd(this,src4RegSlot);
  src1_02 = BuildIntConstOpnd(this,src5RegSlot);
  src1_03 = BuildIntConstOpnd(this,src6RegSlot);
  src1_04 = BuildIntConstOpnd(this,src7RegSlot);
  src1_05 = BuildIntConstOpnd(this,src8RegSlot);
  src1_06 = BuildIntConstOpnd(this,src9RegSlot);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x4000);
  IR::Opnd::SetValueType(&pRVar3->super_Opnd,(ValueType)0x4000);
  pIVar4 = AddExtendedArg(this,pRVar3,(RegOpnd *)0x0,offset);
  pRVar3 = IR::Opnd::AsRegOpnd(pIVar4->m_dst);
  pIVar4 = AddExtendedArg(this,src1,pRVar3,offset);
  pRVar3 = IR::Opnd::AsRegOpnd(pIVar4->m_dst);
  pIVar4 = AddExtendedArg(this,src1_00,pRVar3,offset);
  pRVar3 = IR::Opnd::AsRegOpnd(pIVar4->m_dst);
  pIVar4 = AddExtendedArg(this,src1_01,pRVar3,offset);
  pRVar3 = IR::Opnd::AsRegOpnd(pIVar4->m_dst);
  pIVar4 = AddExtendedArg(this,src1_02,pRVar3,offset);
  pRVar3 = IR::Opnd::AsRegOpnd(pIVar4->m_dst);
  pIVar4 = AddExtendedArg(this,src1_03,pRVar3,offset);
  pRVar3 = IR::Opnd::AsRegOpnd(pIVar4->m_dst);
  pIVar4 = AddExtendedArg(this,src1_04,pRVar3,offset);
  pRVar3 = IR::Opnd::AsRegOpnd(pIVar4->m_dst);
  pIVar4 = AddExtendedArg(this,src1_05,pRVar3,offset);
  pRVar3 = IR::Opnd::AsRegOpnd(pIVar4->m_dst);
  pIVar4 = AddExtendedArg(this,src1_06,pRVar3,offset);
  if ((int)CONCAT62(in_register_00000032,newOpcode) != 0x20c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x161f,"(newOpcode == Js::OpCodeAsmJs::Simd128_Swizzle_U8)",
                       "newOpcode == Js::OpCodeAsmJs::Simd128_Swizzle_U8");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pIVar4 = IR::Instr::New(Simd128_Swizzle_U8,&this_00->super_Opnd,pIVar4->m_dst,this->m_func);
  AddInstr(this,pIVar4,offset);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildUint16x8_2Int8(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG10)
{
    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U8);
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128U8);

    IR::RegOpnd * src2Opnd = BuildIntConstOpnd(src2RegSlot);
    IR::RegOpnd * src3Opnd = BuildIntConstOpnd(src3RegSlot);
    IR::RegOpnd * src4Opnd = BuildIntConstOpnd(src4RegSlot);
    IR::RegOpnd * src5Opnd = BuildIntConstOpnd(src5RegSlot);
    IR::RegOpnd * src6Opnd = BuildIntConstOpnd(src6RegSlot);
    IR::RegOpnd * src7Opnd = BuildIntConstOpnd(src7RegSlot);
    IR::RegOpnd * src8Opnd = BuildIntConstOpnd(src8RegSlot);
    IR::RegOpnd * src9Opnd = BuildIntConstOpnd(src9RegSlot);

    IR::Instr * instr = nullptr;
    dstOpnd->SetValueType(ValueType::Simd);
    src1Opnd->SetValueType(ValueType::Simd);

    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src3Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src4Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src5Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src6Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src7Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src8Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src9Opnd, instr->GetDst()->AsRegOpnd(), offset);

    Assert(newOpcode == Js::OpCodeAsmJs::Simd128_Swizzle_U8);
    Js::OpCode opcode = Js::OpCode::Simd128_Swizzle_U8;

    AddInstr(IR::Instr::New(opcode, dstOpnd, instr->GetDst(), m_func), offset);
}